

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O3

int sat_solver3_solve_internal(sat_solver3 *s)

{
  ABC_INT64_T *pAVar1;
  float fVar2;
  double *pdVar3;
  word *pwVar4;
  lit *plVar5;
  bool bVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  int *orderpos;
  word wVar10;
  int *piVar11;
  int *piVar12;
  float *activity;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  ulong uVar18;
  char cVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  float fVar30;
  double dVar31;
  timespec ts;
  uint *local_b0;
  int local_a4;
  ulong local_a0;
  timespec local_78;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  double local_40;
  long local_38;
  
  if ((s->unit_lits).size < 0) {
LAB_008f0d12:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->unit_lits).size = 0;
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    puts("==================================[MINISAT]===================================");
    puts("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |");
    puts("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |");
    puts("==============================================================================");
  }
  uVar22 = 0;
LAB_008eef43:
  uVar9 = (s->stats).learnts;
  dVar31 = 0.0;
  if (uVar9 != 0) {
    dVar31 = (double)(s->stats).learnts_literals / (double)uVar9;
  }
  iVar20 = (int)uVar22;
  if (s->nRuntimeLimit != 0) {
    iVar8 = clock_gettime(3,&local_78);
    if (iVar8 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    if (s->nRuntimeLimit < lVar14) {
      cVar19 = '\0';
LAB_008f0c00:
      if (0 < s->verbosity) {
        puts("==============================================================================");
      }
      sat_solver3_canceluntil(s,s->root_level);
      return (int)cVar19;
    }
  }
  if (0 < s->verbosity) {
    printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
           SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
           (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
           (double)(s->stats).learnts_literals,dVar31,s->progress_estimate * 100.0);
    fflush(_stdout);
  }
  if (iVar20 == 0) {
    iVar8 = 0;
    iVar24 = 0;
  }
  else {
    iVar28 = 1;
    iVar24 = 0;
    do {
      iVar24 = iVar24 + 1;
      iVar8 = iVar28 * 2;
      iVar28 = iVar28 * 2 + 1;
    } while (iVar8 < iVar20);
  }
  if (iVar8 != iVar20) {
    do {
      iVar24 = iVar24 + -1;
      uVar16 = (long)(int)uVar22 % (long)(iVar8 >> 1);
      uVar22 = uVar16 & 0xffffffff;
      iVar8 = (iVar8 >> 1) + -1;
    } while (iVar8 != (int)uVar16);
  }
  dVar31 = ldexp(1.0,iVar24);
  if (s->root_level != (s->trail_lim).size) {
    __assert_fail("s->root_level == sat_solver3_dl(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                  ,0x6f4,"lbool sat_solver3_search(sat_solver3 *, ABC_INT64_T)");
  }
  iVar8 = s->fNotUseRandom;
  uVar9 = s->nRestarts;
  s->nRestarts = uVar9 + 1;
  (s->stats).starts = (s->stats).starts + 1;
  local_b0 = (uint *)malloc(0x10);
  if (((uVar9 & 1) == 0) && (0 < (s->act_vars).size)) {
    lVar14 = 0;
    do {
      pdVar3 = s->factors;
      if (pdVar3 == (double *)0x0) goto LAB_008ef4a6;
      iVar24 = (s->act_vars).ptr[lVar14];
      iVar28 = s->VarActType;
      if (iVar28 == 2) {
        dVar7 = pdVar3[iVar24];
        if (dVar7 < 1.0) {
          __assert_fail("a >= 1.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                        ,0x41,"xdbl Xdbl_FromDouble(double)");
        }
        uVar22 = ((ulong)dVar7 >> 0x34) - 0x3ff;
        if (0xffff < uVar22) goto LAB_008f0c39;
        uVar16 = s->var_inc;
        pwVar4 = s->activity;
        uVar18 = uVar22 << 0x30 | (ulong)dVar7 >> 5 & 0x7fffffffffff | 0x800000000000;
        uVar22 = uVar18;
        if (uVar18 < uVar16) {
          uVar22 = uVar16;
        }
        if (uVar16 < uVar18) {
          uVar18 = uVar16;
        }
        uVar16 = uVar22 >> 0x20 & 0xffff;
        uVar25 = uVar18 >> 0x20 & 0xffff;
        uVar25 = (uVar16 * (uVar18 & 0xffffffff) >> 0xf) + (uVar25 * (uVar22 & 0xffffffff) >> 0xf) +
                 ((uVar22 & 0xffffffff) * (uVar18 & 0xffffffff) >> 0x2f | uVar16 * uVar25 * 0x20000)
        ;
        uVar23 = uVar25 >> (0xffffffffffff < uVar25);
        uVar16 = pwVar4[iVar24];
        uVar18 = (ulong)(0xffffffffffff < uVar25) + (uVar18 >> 0x30) + (uVar22 >> 0x30);
        uVar22 = 0xffffffffffffffff;
        if (uVar18 < 0x10000) {
          if ((uVar23 & 0xffff800000000000) != 0x800000000000) goto LAB_008f0c39;
          uVar22 = uVar18 << 0x30 | uVar23;
        }
        uVar18 = uVar22;
        if (uVar22 < uVar16) {
          uVar18 = uVar16;
        }
        if (uVar16 < uVar22) {
          uVar22 = uVar16;
        }
        uVar16 = ((uVar22 & 0xffffffffffff) >>
                 ((char)(uVar18 >> 0x30) - (char)(uVar22 >> 0x30) & 0x3fU)) +
                 (uVar18 & 0xffffffffffff);
        uVar22 = (ulong)(0xffffffffffff < uVar16) + (uVar18 >> 0x30);
        uVar16 = uVar16 >> (0xffffffffffff < uVar16);
        if (uVar22 < 0x10000) {
          if ((uVar16 & 0x1800000000000) != 0x800000000000) goto LAB_008f0c39;
          uVar16 = uVar22 << 0x30 | uVar16;
          pwVar4[iVar24] = uVar16;
          if (0x14c924d692ca61b < uVar16) goto LAB_008ef42a;
        }
        else {
          pwVar4[iVar24] = 0xffffffffffffffff;
LAB_008ef42a:
          act_var_rescale(s);
        }
        piVar11 = s->orderpos;
        uVar22 = (ulong)piVar11[iVar24];
        if (uVar22 != 0xffffffffffffffff) {
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] == 0) {
LAB_008ef495:
            uVar21 = 0;
          }
          else {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar22;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar24 = piVar12[(int)uVar27];
              uVar21 = uVar9;
              if (uVar16 <= pwVar4[iVar24]) break;
              piVar12[(int)uVar9] = iVar24;
              piVar11[iVar24] = uVar9;
              uVar22 = (ulong)uVar27;
              uVar21 = uVar27;
            } while (2 < uVar9);
          }
LAB_008ef49d:
          piVar12[(int)uVar21] = (int)lVar15;
          piVar11[lVar15] = uVar21;
        }
      }
      else {
        if (iVar28 == 1) {
          dVar7 = (double)s->var_inc * pdVar3[iVar24] + (double)s->activity[iVar24];
          s->activity[iVar24] = (word)dVar7;
          if (1e+100 < dVar7) {
            act_var_rescale(s);
          }
          piVar11 = s->orderpos;
          uVar22 = (ulong)piVar11[iVar24];
          if (uVar22 == 0xffffffffffffffff) goto LAB_008ef4a6;
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] == 0) goto LAB_008ef495;
          pwVar4 = s->activity;
          uVar16 = pwVar4[lVar15];
          do {
            uVar9 = (uint)uVar22;
            uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
            iVar24 = piVar12[(int)uVar27];
            uVar21 = uVar9;
            if (uVar16 <= pwVar4[iVar24]) break;
            piVar12[(int)uVar9] = iVar24;
            piVar11[iVar24] = uVar9;
            uVar22 = (ulong)uVar27;
            uVar21 = uVar27;
          } while (2 < uVar9);
          goto LAB_008ef49d;
        }
        if (iVar28 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                        ,0x184,"void act_var_bump_factor(sat_solver3 *, int)");
        }
        wVar10 = (long)(int)((float)pdVar3[iVar24] * (float)(uint)s->var_inc) + s->activity[iVar24];
        s->activity[iVar24] = wVar10;
        if ((int)wVar10 < 0) {
          act_var_rescale(s);
        }
        piVar11 = s->orderpos;
        uVar22 = (ulong)piVar11[iVar24];
        if (uVar22 != 0xffffffffffffffff) {
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] != 0) {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar22;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar24 = piVar12[(int)uVar27];
              uVar21 = uVar9;
              if (uVar16 <= pwVar4[iVar24]) break;
              piVar12[(int)uVar9] = iVar24;
              piVar11[iVar24] = uVar9;
              uVar22 = (ulong)uVar27;
              uVar21 = uVar27;
            } while (2 < uVar9);
            goto LAB_008ef49d;
          }
          goto LAB_008ef495;
        }
      }
LAB_008ef4a6:
      lVar14 = lVar14 + 1;
    } while (lVar14 < (s->act_vars).size);
  }
  if ((s->pGlobalVars != (int *)0x0) && (0 < (s->act_vars).size)) {
    lVar14 = 0;
    do {
      if ((s->pGlobalVars == (int *)0x0) ||
         (iVar24 = (s->act_vars).ptr[lVar14], s->pGlobalVars[iVar24] == 0)) goto LAB_008ef836;
      iVar28 = s->VarActType;
      if (iVar28 == 2) {
        uVar22 = s->var_inc;
        uVar16 = 0x1c00000000000;
        if (uVar22 < 0x1c00000000000) {
          uVar16 = uVar22;
        }
        if (uVar22 < 0x1c00000000001) {
          uVar22 = 0x1c00000000000;
        }
        pwVar4 = s->activity;
        uVar18 = uVar22 >> 0x20 & 0xffff;
        uVar25 = uVar16 >> 0x20 & 0xffff;
        uVar25 = (uVar18 * (uVar16 & 0xffffffff) >> 0xf) + (uVar25 * (uVar22 & 0xffffffff) >> 0xf) +
                 ((uVar22 & 0xffffffff) * (uVar16 & 0xffffffff) >> 0x2f | uVar18 * uVar25 * 0x20000)
        ;
        uVar23 = uVar25 >> (0xffffffffffff < uVar25);
        uVar18 = pwVar4[iVar24];
        uVar16 = (ulong)(0xffffffffffff < uVar25) + (uVar16 >> 0x30) + (uVar22 >> 0x30);
        uVar22 = 0xffffffffffffffff;
        if (uVar16 < 0x10000) {
          if ((uVar23 & 0xffff800000000000) != 0x800000000000) goto LAB_008f0c39;
          uVar22 = uVar16 << 0x30 | uVar23;
        }
        uVar16 = uVar22;
        if (uVar22 < uVar18) {
          uVar16 = uVar18;
        }
        if (uVar18 < uVar22) {
          uVar22 = uVar18;
        }
        uVar18 = ((uVar22 & 0xffffffffffff) >>
                 ((char)(uVar16 >> 0x30) - (char)(uVar22 >> 0x30) & 0x3fU)) +
                 (uVar16 & 0xffffffffffff);
        uVar22 = (ulong)(0xffffffffffff < uVar18) + (uVar16 >> 0x30);
        uVar18 = uVar18 >> (0xffffffffffff < uVar18);
        if (uVar22 < 0x10000) {
          if ((uVar18 & 0x1800000000000) != 0x800000000000) goto LAB_008f0c39;
          uVar18 = uVar22 << 0x30 | uVar18;
          pwVar4[iVar24] = uVar18;
          if (0x14c924d692ca61b < uVar18) goto LAB_008ef7ba;
        }
        else {
          pwVar4[iVar24] = 0xffffffffffffffff;
LAB_008ef7ba:
          act_var_rescale(s);
        }
        piVar11 = s->orderpos;
        uVar22 = (ulong)piVar11[iVar24];
        if (uVar22 != 0xffffffffffffffff) {
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] == 0) {
LAB_008ef825:
            uVar21 = 0;
          }
          else {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar22;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar24 = piVar12[(int)uVar27];
              uVar21 = uVar9;
              if (uVar16 <= pwVar4[iVar24]) break;
              piVar12[(int)uVar9] = iVar24;
              piVar11[iVar24] = uVar9;
              uVar22 = (ulong)uVar27;
              uVar21 = uVar27;
            } while (2 < uVar9);
          }
LAB_008ef82d:
          piVar12[(int)uVar21] = (int)lVar15;
          piVar11[lVar15] = uVar21;
        }
      }
      else {
        if (iVar28 == 1) {
          dVar7 = (double)s->var_inc * 3.0 + (double)s->activity[iVar24];
          s->activity[iVar24] = (word)dVar7;
          if (1e+100 < dVar7) {
            act_var_rescale(s);
          }
          piVar11 = s->orderpos;
          uVar22 = (ulong)piVar11[iVar24];
          if (uVar22 == 0xffffffffffffffff) goto LAB_008ef836;
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] == 0) goto LAB_008ef825;
          pwVar4 = s->activity;
          uVar16 = pwVar4[lVar15];
          do {
            uVar9 = (uint)uVar22;
            uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
            iVar24 = piVar12[(int)uVar27];
            uVar21 = uVar9;
            if (uVar16 <= pwVar4[iVar24]) break;
            piVar12[(int)uVar9] = iVar24;
            piVar11[iVar24] = uVar9;
            uVar22 = (ulong)uVar27;
            uVar21 = uVar27;
          } while (2 < uVar9);
          goto LAB_008ef82d;
        }
        if (iVar28 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                        ,0x165,"void act_var_bump_global(sat_solver3 *, int)");
        }
        wVar10 = ((long)((s->var_inc << 0x20) * 3) >> 0x20) + s->activity[iVar24];
        s->activity[iVar24] = wVar10;
        if ((int)wVar10 < 0) {
          act_var_rescale(s);
        }
        piVar11 = s->orderpos;
        uVar22 = (ulong)piVar11[iVar24];
        if (uVar22 != 0xffffffffffffffff) {
          piVar12 = (s->order).ptr;
          lVar15 = (long)piVar12[uVar22];
          if (piVar11[iVar24] != 0) {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar22;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar24 = piVar12[(int)uVar27];
              uVar21 = uVar9;
              if (uVar16 <= pwVar4[iVar24]) break;
              piVar12[(int)uVar9] = iVar24;
              piVar11[iVar24] = uVar9;
              uVar22 = (ulong)uVar27;
              uVar21 = uVar27;
            } while (2 < uVar9);
            goto LAB_008ef82d;
          }
          goto LAB_008ef825;
        }
      }
LAB_008ef836:
      lVar14 = lVar14 + 1;
    } while (lVar14 < (s->act_vars).size);
  }
  local_40 = 0.019999999552965164;
  if (iVar8 != 0) {
    local_40 = 0.0;
  }
  local_38 = (long)(dVar31 * 100.0);
  local_a4 = 4;
  uVar22 = 0;
  local_48 = 0;
LAB_008ef88d:
  while (uVar9 = sat_solver3_propagate(s), uVar9 != 0) {
    pAVar1 = &(s->stats).conflicts;
    *pAVar1 = *pAVar1 + 1;
    if ((s->trail_lim).size == s->root_level) {
      sat_solver3_analyze_final(s,uVar9,0);
      cVar19 = -1;
      goto LAB_008f0b0d;
    }
    if ((int)uVar22 < 0) goto LAB_008f0d12;
    plVar5 = s->trail;
    iVar8 = s->qtail;
    if (local_a4 == 0) {
      if (local_b0 == (uint *)0x0) {
        local_b0 = (uint *)malloc(0);
      }
      else {
        local_b0 = (uint *)realloc(local_b0,0);
      }
      if (local_b0 == (uint *)0x0) {
LAB_008f0daa:
        sat_solver3_solve_internal_cold_3();
        goto LAB_008f0daf;
      }
    }
    local_48 = local_48 + 1;
    iVar8 = iVar8 + -1;
    *local_b0 = 0xfffffffe;
    uVar21 = 0xfffffffe;
    local_a0 = 1;
    iVar24 = 0;
    do {
      if (uVar9 == 0) {
        __assert_fail("h != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                      ,0x37c,"void sat_solver3_analyze(sat_solver3 *, int, veci *)");
      }
      if ((uVar9 & 1) == 0) {
        uVar27 = (s->Mem).uPageMask & uVar9;
        if (uVar27 == 0) {
LAB_008f0c77:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        puVar17 = (uint *)((s->Mem).pPages[(int)uVar9 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                          (int)uVar27);
        if ((*puVar17 & 1) != 0) {
          piVar11 = (s->act_clas).ptr;
          uVar9 = puVar17[(ulong)(*puVar17 >> 0xb) + 1];
          if (s->ClaActType == 0) {
            piVar12 = piVar11 + (int)uVar9;
            *piVar12 = *piVar12 + s->cla_inc;
            if (*piVar12 < 0) {
              uVar9 = (s->act_clas).size;
              if (s->ClaActType != 0) {
                if (0 < (int)uVar9) {
                  uVar22 = 0;
                  do {
                    piVar11[uVar22] = (int)((float)piVar11[uVar22] * 1e-20);
                    uVar22 = uVar22 + 1;
                  } while (uVar9 != uVar22);
                }
                fVar30 = (float)s->cla_inc;
                goto LAB_008efd53;
              }
              if (0 < (int)uVar9) {
                lVar14 = 0;
                do {
                  piVar11[lVar14] = (uint)piVar11[lVar14] >> 0xe;
                  lVar14 = lVar14 + 1;
                } while (lVar14 < (s->act_clas).size);
              }
              uVar9 = s->cla_inc >> 0xe;
              if (uVar9 < 0x401) {
                uVar9 = 0x400;
              }
              goto LAB_008efd58;
            }
          }
          else {
            fVar30 = (float)s->cla_inc;
            fVar2 = (float)piVar11[(int)uVar9];
            piVar11[(int)uVar9] = (int)(fVar2 + fVar30);
            if (1e+20 < fVar2 + fVar30) {
              lVar14 = (long)(s->act_clas).size;
              if (0 < lVar14) {
                lVar15 = 0;
                do {
                  piVar11[lVar15] = (int)((float)piVar11[lVar15] * 1e-20);
                  lVar15 = lVar15 + 1;
                } while (lVar14 != lVar15);
              }
LAB_008efd53:
              uVar9 = (uint)(long)(fVar30 * 1e-20);
LAB_008efd58:
              s->cla_inc = uVar9;
            }
          }
        }
        if ((uint)(uVar21 != 0xfffffffe) < *puVar17 >> 0xb) {
          uVar22 = (ulong)(uVar21 != 0xfffffffe);
          do {
            iVar28 = (int)puVar17[uVar22 + 1] >> 1;
            pcVar13 = s->tags;
            if ((pcVar13[iVar28] == '\0') && (0 < s->levels[iVar28])) {
              uVar9 = (s->tagged).size;
              piVar11 = (s->tagged).ptr;
              if (uVar9 == (s->tagged).cap) {
                iVar29 = (uVar9 >> 1) * 3;
                if ((int)uVar9 < 4) {
                  iVar29 = uVar9 * 2;
                }
                if (piVar11 == (int *)0x0) {
                  piVar11 = (int *)malloc((long)iVar29 << 2);
                }
                else {
                  piVar11 = (int *)realloc(piVar11,(long)iVar29 << 2);
                }
                (s->tagged).ptr = piVar11;
                if (piVar11 == (int *)0x0) {
                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                         SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                         (double)iVar29 * 9.5367431640625e-07);
                  fflush(_stdout);
                }
                (s->tagged).cap = iVar29;
                uVar9 = (s->tagged).size;
                pcVar13 = s->tags;
              }
              (s->tagged).size = uVar9 + 1;
              piVar11[(int)uVar9] = iVar28;
              pcVar13[iVar28] = '\x01';
              act_var_bump(s,iVar28);
              if (s->levels[iVar28] == (s->trail_lim).size) {
                iVar24 = iVar24 + 1;
              }
              else {
                uVar9 = puVar17[uVar22 + 1];
                iVar28 = (int)local_a0;
                if (iVar28 == local_a4) {
                  local_a4 = (int)(local_a0 >> 1) * 3;
                  if (iVar28 < 4) {
                    local_a4 = iVar28 * 2;
                  }
                  if (local_b0 == (uint *)0x0) {
                    local_b0 = (uint *)malloc((long)local_a4 << 2);
                  }
                  else {
                    local_b0 = (uint *)realloc(local_b0,(long)local_a4 << 2);
                  }
                  if (local_b0 == (uint *)0x0) {
                    sat_solver3_solve_internal_cold_2();
                    goto LAB_008f0d3f;
                  }
                }
                local_a0 = (ulong)(iVar28 + 1);
                local_b0[iVar28] = uVar9;
              }
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 < *puVar17 >> 0xb);
        }
      }
      else {
        iVar28 = (int)uVar9 >> 2;
        pcVar13 = s->tags;
        if ((pcVar13[iVar28] == '\0') && (0 < s->levels[iVar28])) {
          uVar21 = (s->tagged).size;
          piVar11 = (s->tagged).ptr;
          if (uVar21 == (s->tagged).cap) {
            iVar29 = (uVar21 >> 1) * 3;
            if ((int)uVar21 < 4) {
              iVar29 = uVar21 * 2;
            }
            if (piVar11 == (int *)0x0) {
              piVar11 = (int *)malloc((long)iVar29 << 2);
            }
            else {
              piVar11 = (int *)realloc(piVar11,(long)iVar29 << 2);
            }
            (s->tagged).ptr = piVar11;
            if (piVar11 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                     (double)iVar29 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->tagged).cap = iVar29;
            uVar21 = (s->tagged).size;
            pcVar13 = s->tags;
          }
          (s->tagged).size = uVar21 + 1;
          piVar11[(int)uVar21] = iVar28;
          pcVar13[iVar28] = '\x01';
          act_var_bump(s,iVar28);
          if (s->levels[iVar28] == (s->trail_lim).size) {
            iVar24 = iVar24 + 1;
          }
          else {
            iVar28 = (int)local_a0;
            if (iVar28 == local_a4) {
              local_a4 = (int)(local_a0 >> 1) * 3;
              if (iVar28 < 4) {
                local_a4 = iVar28 * 2;
              }
              if (local_b0 == (uint *)0x0) {
                local_b0 = (uint *)malloc((long)local_a4 << 2);
              }
              else {
                local_b0 = (uint *)realloc(local_b0,(long)local_a4 << 2);
              }
              if (local_b0 == (uint *)0x0) {
                sat_solver3_solve_internal_cold_1();
                goto LAB_008f0daa;
              }
            }
            local_a0 = (ulong)(iVar28 + 1);
            local_b0[iVar28] = (int)uVar9 >> 1;
          }
        }
      }
      puVar17 = (uint *)(plVar5 + iVar8);
      do {
        uVar21 = *puVar17;
        puVar17 = puVar17 + -1;
        iVar8 = iVar8 + -1;
      } while (s->tags[(int)uVar21 >> 1] == '\0');
      uVar9 = s->reasons[(int)uVar21 >> 1];
      bVar6 = 1 < iVar24;
      iVar24 = iVar24 + -1;
    } while (bVar6);
    *local_b0 = uVar21 ^ 1;
    uVar22 = 1;
    if (1 < (int)local_a0) {
      local_68 = local_a0;
      uVar9 = 0;
      uVar22 = 1;
      do {
        uVar9 = uVar9 | 1 << (*(byte *)(s->levels + ((int)local_b0[uVar22] >> 1)) & 0x1f);
        uVar22 = uVar22 + 1;
      } while (local_a0 != uVar22);
      uVar22 = 1;
      uVar16 = 1;
      uVar18 = local_a0;
      do {
        uVar21 = local_b0[uVar16];
        if (s->reasons[(int)uVar21 >> 1] == 0) {
LAB_008f06d1:
          local_b0[(int)uVar22] = uVar21;
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        else {
          if ((s->stack).size < 0) goto LAB_008f0d12;
          iVar8 = (s->tagged).size;
          (s->stack).size = 0;
          iVar24 = 0;
          piVar11 = (s->stack).ptr;
          if ((s->stack).cap == 0) {
            if (piVar11 == (int *)0x0) {
              piVar11 = (int *)malloc(0);
            }
            else {
              piVar11 = (int *)realloc(piVar11,0);
            }
            (s->stack).ptr = piVar11;
            if (piVar11 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),0);
              fflush(_stdout);
            }
            (s->stack).cap = 0;
            iVar24 = (s->stack).size;
          }
          (s->stack).size = iVar24 + 1;
          piVar11[iVar24] = (int)uVar21 >> 1;
          iVar24 = (s->stack).size;
          if (iVar24 != 0) {
            local_50 = (long)iVar8;
            local_60 = uVar16;
            local_58 = uVar22;
            do {
              piVar11 = s->reasons;
              piVar12 = (s->stack).ptr;
              (s->stack).size = iVar24 + -1;
              uVar21 = piVar11[piVar12[(long)iVar24 + -1]];
              if (uVar21 == 0) {
                __assert_fail("s->reasons[v] != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                              ,0x2ef,"int sat_solver3_lit_removable(sat_solver3 *, int, int)");
              }
              if ((uVar21 & 1) != 0) {
                iVar28 = (int)uVar21 >> 2;
                pcVar13 = s->tags;
                if ((pcVar13[iVar28] != '\0') || (s->levels[iVar28] == 0)) goto LAB_008f064f;
                if ((piVar11[iVar28] != 0) && ((uVar9 >> (s->levels[iVar28] & 0x1fU) & 1) != 0)) {
                  lVar14 = (long)iVar24 + -1;
                  uVar21 = (uint)lVar14;
                  if (uVar21 == (s->stack).cap) {
                    iVar29 = (uVar21 >> 1) * 3;
                    if (iVar24 < 5) {
                      iVar29 = uVar21 * 2;
                    }
                    piVar12 = (int *)realloc(piVar12,(long)iVar29 << 2);
                    (s->stack).ptr = piVar12;
                    if (piVar12 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                             (double)iVar29 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    (s->stack).cap = iVar29;
                    iVar24 = (s->stack).size;
                    lVar14 = (long)iVar24;
                    pcVar13 = s->tags;
                    iVar24 = iVar24 + 1;
                  }
                  (s->stack).size = iVar24;
                  piVar12[lVar14] = iVar28;
                  if (pcVar13[iVar28] == '\0') {
                    uVar21 = (s->tagged).size;
                    piVar11 = (s->tagged).ptr;
                    if (uVar21 == (s->tagged).cap) {
                      iVar24 = (uVar21 >> 1) * 3;
                      if ((int)uVar21 < 4) {
                        iVar24 = uVar21 * 2;
                      }
                      if (piVar11 == (int *)0x0) {
                        piVar11 = (int *)malloc((long)iVar24 << 2);
                      }
                      else {
                        piVar11 = (int *)realloc(piVar11,(long)iVar24 << 2);
                      }
                      (s->tagged).ptr = piVar11;
                      if (piVar11 == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                               (double)iVar24 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->tagged).cap = iVar24;
                      uVar21 = (s->tagged).size;
                      pcVar13 = s->tags;
                    }
                    (s->tagged).size = uVar21 + 1;
                    piVar11[(int)uVar21] = iVar28;
                  }
                  pcVar13[iVar28] = '\x01';
                  goto LAB_008f064f;
                }
                iVar24 = (s->tagged).size;
                if (iVar8 < iVar24) {
                  piVar11 = (s->tagged).ptr;
                  lVar14 = local_50;
                  do {
                    s->tags[piVar11[lVar14]] = '\0';
                    lVar14 = lVar14 + 1;
                    iVar24 = (s->tagged).size;
                  } while (lVar14 < iVar24);
                }
LAB_008f06ba:
                if (iVar24 < iVar8) goto LAB_008f0d12;
                (s->tagged).size = iVar8;
                uVar21 = local_b0[local_60];
                uVar22 = local_58;
                uVar16 = local_60;
                uVar18 = local_68;
                goto LAB_008f06d1;
              }
              uVar27 = (s->Mem).uPageMask & uVar21;
              if (uVar27 == 0) goto LAB_008f0c77;
              piVar11 = (s->Mem).pPages[(int)uVar21 >> ((byte)(s->Mem).nPageSize & 0x1f)];
              uVar21 = piVar11[(int)uVar27];
              if (0xfff < uVar21) {
                uVar22 = 1;
                do {
                  iVar24 = piVar11[(long)(int)uVar27 + uVar22 + 1] >> 1;
                  pcVar13 = s->tags;
                  if ((pcVar13[iVar24] == '\0') && (s->levels[iVar24] != 0)) {
                    if ((s->reasons[iVar24] == 0) ||
                       ((uVar9 >> (s->levels[iVar24] & 0x1fU) & 1) == 0)) {
                      iVar24 = (s->tagged).size;
                      if (iVar8 < iVar24) {
                        piVar11 = (s->tagged).ptr;
                        lVar14 = local_50;
                        do {
                          s->tags[piVar11[lVar14]] = '\0';
                          lVar14 = lVar14 + 1;
                          iVar24 = (s->tagged).size;
                        } while (lVar14 < iVar24);
                      }
                      goto LAB_008f06ba;
                    }
                    uVar21 = (s->stack).size;
                    piVar12 = (s->stack).ptr;
                    if (uVar21 == (s->stack).cap) {
                      iVar28 = (uVar21 >> 1) * 3;
                      if ((int)uVar21 < 4) {
                        iVar28 = uVar21 * 2;
                      }
                      if (piVar12 == (int *)0x0) {
                        piVar12 = (int *)malloc((long)iVar28 << 2);
                      }
                      else {
                        piVar12 = (int *)realloc(piVar12,(long)iVar28 << 2);
                      }
                      (s->stack).ptr = piVar12;
                      if (piVar12 == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                               (double)iVar28 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->stack).cap = iVar28;
                      uVar21 = (s->stack).size;
                      pcVar13 = s->tags;
                    }
                    (s->stack).size = uVar21 + 1;
                    piVar12[(int)uVar21] = iVar24;
                    if (pcVar13[iVar24] == '\0') {
                      uVar21 = (s->tagged).size;
                      piVar12 = (s->tagged).ptr;
                      if (uVar21 == (s->tagged).cap) {
                        iVar28 = (uVar21 >> 1) * 3;
                        if ((int)uVar21 < 4) {
                          iVar28 = uVar21 * 2;
                        }
                        if (piVar12 == (int *)0x0) {
                          piVar12 = (int *)malloc((long)iVar28 << 2);
                        }
                        else {
                          piVar12 = (int *)realloc(piVar12,(long)iVar28 << 2);
                        }
                        (s->tagged).ptr = piVar12;
                        if (piVar12 == (int *)0x0) {
                          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                 SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                 (double)iVar28 * 9.5367431640625e-07);
                          fflush(_stdout);
                        }
                        (s->tagged).cap = iVar28;
                        uVar21 = (s->tagged).size;
                        pcVar13 = s->tags;
                      }
                      (s->tagged).size = uVar21 + 1;
                      piVar12[(int)uVar21] = iVar24;
                    }
                    pcVar13[iVar24] = '\x01';
                    uVar21 = piVar11[(int)uVar27];
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 < uVar21 >> 0xb);
              }
LAB_008f064f:
              iVar24 = (s->stack).size;
              uVar22 = local_58;
              uVar16 = local_60;
              uVar18 = local_68;
            } while (iVar24 != 0);
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar18);
    }
    iVar8 = (int)uVar22;
    if ((int)local_a0 < iVar8) goto LAB_008f0d12;
    pAVar1 = &(s->stats).tot_literals;
    *pAVar1 = *pAVar1 + (long)iVar8;
    iVar24 = (s->tagged).size;
    if (0 < iVar24) {
      piVar11 = (s->tagged).ptr;
      lVar14 = 0;
      do {
        s->tags[piVar11[lVar14]] = '\0';
        lVar14 = lVar14 + 1;
        iVar24 = (s->tagged).size;
      } while (lVar14 < iVar24);
    }
    if (iVar24 < 0) goto LAB_008f0d12;
    (s->tagged).size = 0;
    if (iVar8 < 2) {
      sat_solver3_canceluntil(s,s->root_level);
      iVar24 = 0;
    }
    else {
      uVar9 = local_b0[1];
      piVar11 = s->levels;
      iVar24 = piVar11[(int)uVar9 >> 1];
      uVar16 = 2;
      if (iVar8 != 2) {
        uVar16 = uVar22 & 0xffffffff;
        uVar18 = 1;
        uVar25 = 2;
        do {
          if (iVar24 < piVar11[(int)local_b0[uVar25] >> 1]) {
            uVar18 = uVar25 & 0xffffffff;
            iVar24 = piVar11[(int)local_b0[uVar25] >> 1];
          }
          uVar25 = uVar25 + 1;
        } while (uVar16 != uVar25);
        local_b0[1] = local_b0[(int)uVar18];
        local_b0[(int)uVar18] = uVar9;
        iVar24 = piVar11[(int)local_b0[1] >> 1];
      }
      if (iVar24 < s->root_level) {
        iVar24 = s->root_level;
      }
      sat_solver3_canceluntil(s,iVar24);
      iVar24 = sat_solver3_clause_new(s,(lit *)local_b0,(lit *)(local_b0 + uVar16),1);
    }
    uVar9 = *local_b0;
    iVar28 = (int)uVar9 >> 1;
    if (s->pFreqs[iVar28] == '\0') {
      s->pFreqs[iVar28] = '\x01';
    }
    if (s->assigns[iVar28] == '\x03') {
      s->assigns[iVar28] = (byte)uVar9 & 1;
      s->levels[iVar28] = (s->trail_lim).size;
      s->reasons[iVar28] = iVar24;
      iVar28 = s->qtail;
      s->qtail = iVar28 + 1;
      s->trail[iVar28] = uVar9;
    }
    if (iVar8 < 1) {
      __assert_fail("veci_size(cls) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                    ,0x2bf,"void sat_solver3_record(sat_solver3 *, veci *)");
    }
    if (iVar24 == 0) {
      uVar9 = *local_b0;
      uVar21 = (s->unit_lits).size;
      piVar11 = (s->unit_lits).ptr;
      if (uVar21 == (s->unit_lits).cap) {
        iVar24 = (uVar21 >> 1) * 3;
        if ((int)uVar21 < 4) {
          iVar24 = uVar21 * 2;
        }
        if (piVar11 == (int *)0x0) {
          piVar11 = (int *)malloc((long)iVar24 << 2);
        }
        else {
          piVar11 = (int *)realloc(piVar11,(long)iVar24 << 2);
        }
        (s->unit_lits).ptr = piVar11;
        if (piVar11 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->unit_lits).cap * 9.5367431640625e-07,0),
                 (double)iVar24 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->unit_lits).cap = iVar24;
        uVar21 = (s->unit_lits).size;
      }
      (s->unit_lits).size = uVar21 + 1;
      piVar11[(int)uVar21] = uVar9;
    }
    if (iVar8 == 1) {
      s->levels[(int)*local_b0 >> 1] = 0;
    }
    iVar8 = s->VarActType;
    if (iVar8 == 2) {
      uVar16 = s->var_inc;
      uVar18 = s->var_decay;
      uVar25 = uVar18;
      if (uVar16 >= uVar18 && uVar16 != uVar18) {
        uVar25 = uVar16;
      }
      if (uVar16 < uVar18) {
        uVar18 = uVar16;
      }
      uVar16 = uVar25 >> 0x20 & 0xffff;
      uVar23 = uVar18 >> 0x20 & 0xffff;
      uVar16 = (uVar16 * (uVar18 & 0xffffffff) >> 0xf) + (uVar23 * (uVar25 & 0xffffffff) >> 0xf) +
               ((uVar25 & 0xffffffff) * (uVar18 & 0xffffffff) >> 0x2f | uVar16 * uVar23 * 0x20000);
      uVar23 = uVar16 >> (0xffffffffffff < uVar16);
      uVar16 = (ulong)(0xffffffffffff < uVar16) + (uVar18 >> 0x30) + (uVar25 >> 0x30);
      uVar18 = 0xffffffffffffffff;
      if (uVar16 < 0x10000) {
        if ((uVar23 & 0xffff800000000000) != 0x800000000000) {
LAB_008f0c39:
          __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                        ,0x36,"xdbl Xdbl_Create(word, word)");
        }
        uVar18 = uVar16 << 0x30 | uVar23;
      }
      s->var_inc = uVar18;
    }
    else if (iVar8 == 1) {
      s->var_inc = (word)((double)s->var_inc * (double)s->var_decay);
    }
    else {
      if (iVar8 != 0) {
LAB_008f0daf:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                      ,399,"void act_var_decay(sat_solver3 *)");
      }
      s->var_inc = (s->var_inc >> 4) + s->var_inc;
    }
    if (s->ClaActType == 0) {
      uVar9 = (s->cla_inc >> 10) + s->cla_inc;
    }
    else {
      uVar9 = s->cla_inc * s->cla_decay;
    }
    s->cla_inc = uVar9;
  }
  if ((local_38 < 0 || local_48 < local_38) || s->fNoRestarts != 0) {
    if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
      iVar8 = clock_gettime(3,&local_78);
      if (iVar8 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      if (s->nRuntimeLimit < lVar14) goto LAB_008f0bc4;
    }
    if (((s->nConfLimit == 0) || ((s->stats).conflicts <= s->nConfLimit)) &&
       ((s->nInsLimit == 0 || ((s->stats).propagations <= s->nInsLimit)))) {
      if (((s->trail_lim).size == 0) && (s->fSkipSimplify == 0)) {
        sat_solver3_simplify(s);
      }
      if ((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) {
        sat_solver3_reducedb(s);
      }
      pAVar1 = &(s->stats).decisions;
      *pAVar1 = *pAVar1 + 1;
      piVar11 = s->orderpos;
      dVar31 = s->random_seed * 1389796.0;
      puVar17 = (uint *)(s->order).ptr;
      dVar31 = dVar31 - (double)(int)(dVar31 / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar31;
      if (local_40 <= dVar31 / 2147483647.0) {
LAB_008efa5e:
        do {
          uVar21 = (s->order).size;
          if ((int)uVar21 < 1) goto LAB_008f0ac6;
          uVar9 = *puVar17;
          uVar26 = uVar21 - 1;
          uVar27 = puVar17[uVar26];
          (s->order).size = uVar26;
          uVar16 = (ulong)(int)uVar9;
          piVar11[uVar16] = -1;
          if (uVar21 != 1) {
            if (uVar21 < 3) {
              iVar8 = 0;
            }
            else {
              pwVar4 = s->activity;
              uVar18 = pwVar4[(int)uVar27];
              iVar24 = 1;
              iVar8 = 0;
              do {
                iVar28 = iVar24 + 1;
                if (((int)uVar26 <= iVar28) ||
                   (pwVar4[(int)puVar17[iVar28]] <= pwVar4[(int)puVar17[iVar24]])) {
                  iVar28 = iVar24;
                }
                uVar21 = puVar17[iVar28];
                if (pwVar4[(int)uVar21] <= uVar18) break;
                puVar17[iVar8] = uVar21;
                piVar11[(int)uVar21] = iVar8;
                iVar24 = iVar28 * 2 + 1;
                iVar8 = iVar28;
              } while (iVar24 < (int)uVar26);
            }
            puVar17[iVar8] = uVar27;
            piVar11[(int)uVar27] = iVar8;
          }
        } while (s->assigns[uVar16] != '\x03');
        if (uVar9 == 0xffffffff) goto LAB_008f0ac6;
      }
      else {
        dVar31 = dVar31 * 1389796.0 -
                 (double)(int)((dVar31 * 1389796.0) / 2147483647.0) * 2147483647.0;
        s->random_seed = dVar31;
        uVar9 = (uint)((double)s->size * (dVar31 / 2147483647.0));
        if (((int)uVar9 < 0) || (s->size <= (int)uVar9)) {
LAB_008f0d3f:
          __assert_fail("next >= 0 && next < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                        ,0xb4,"int order_select(sat_solver3 *, float)");
        }
        uVar16 = (ulong)uVar9;
        if (s->assigns[uVar16] != '\x03') goto LAB_008efa5e;
      }
      uVar9 = uVar9 * 2;
      if (s->polarity[uVar16] == '\0') {
        uVar9 = uVar9 | 1;
      }
      sat_solver3_decision(s,uVar9);
      goto LAB_008ef88d;
    }
  }
LAB_008f0bc4:
  dVar31 = sat_solver3_progress(s);
  s->progress_estimate = dVar31;
  sat_solver3_canceluntil(s,s->root_level);
  cVar19 = '\0';
  goto LAB_008f0b0d;
LAB_008f0ac6:
  if (0 < s->size) {
    pcVar13 = s->assigns;
    piVar11 = s->model;
    lVar14 = 0;
    do {
      piVar11[lVar14] = -(uint)(pcVar13[lVar14] != '\0') | 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < s->size);
  }
  sat_solver3_canceluntil(s,s->root_level);
  cVar19 = '\x01';
LAB_008f0b0d:
  if (local_b0 != (uint *)0x0) {
    free(local_b0);
  }
  if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
     ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_008f0c00;
  if (s->nRuntimeLimit != 0) {
    iVar8 = clock_gettime(3,&local_78);
    if (iVar8 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
    }
    if (s->nRuntimeLimit < lVar14) goto LAB_008f0c00;
  }
  uVar22 = (ulong)(iVar20 + 1);
  if (cVar19 != '\0') goto LAB_008f0c00;
  goto LAB_008eef43;
}

Assistant:

int sat_solver3_solve_internal(sat_solver3* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver3_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver3_canceluntil(s,s->root_level);
    return status;
}